

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedEnumFieldGenerator::GenerateInlineAccessorDefinitions
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  RepeatedEnumFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "inline $type$ $classname$::_internal_$name$(int index) const {\n  return static_cast< $type$ >($name$_.Get(index));\n}\ninline $type$ $classname$::$name$(int index) const {\n$annotate_get$  // @@protoc_insertion_point(field_get:$full_name$)\n  return _internal_$name$(index);\n}\ninline void $classname$::set_$name$(int index, $type$ value) {\n"
            );
  bVar1 = HasPreservingUnknownEnumSemantics((this->super_FieldGenerator).descriptor_);
  if (!bVar1) {
    Formatter::operator()<>((Formatter *)local_50,"  assert($type$_IsValid(value));\n");
  }
  Formatter::operator()<>
            ((Formatter *)local_50,
             "  $name$_.Set(index, value);\n$annotate_set$  // @@protoc_insertion_point(field_set:$full_name$)\n}\ninline void $classname$::_internal_add_$name$($type$ value) {\n"
            );
  bVar1 = HasPreservingUnknownEnumSemantics((this->super_FieldGenerator).descriptor_);
  if (!bVar1) {
    Formatter::operator()<>((Formatter *)local_50,"  assert($type$_IsValid(value));\n");
  }
  Formatter::operator()<>
            ((Formatter *)local_50,
             "  $name$_.Add(value);\n}\ninline void $classname$::add_$name$($type$ value) {\n  _internal_add_$name$(value);\n$annotate_add$  // @@protoc_insertion_point(field_add:$full_name$)\n}\ninline const ::$proto_ns$::RepeatedField<int>&\n$classname$::$name$() const {\n$annotate_list$  // @@protoc_insertion_point(field_list:$full_name$)\n  return $name$_;\n}\ninline ::$proto_ns$::RepeatedField<int>*\n$classname$::_internal_mutable_$name$() {\n  return &$name$_;\n}\ninline ::$proto_ns$::RepeatedField<int>*\n$classname$::mutable_$name$() {\n$annotate_mutable_list$  // @@protoc_insertion_point(field_mutable_list:$full_name$)\n  return _internal_mutable_$name$();\n}\n"
            );
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::GenerateInlineAccessorDefinitions(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "inline $type$ $classname$::_internal_$name$(int index) const {\n"
      "  return static_cast< $type$ >($name$_.Get(index));\n"
      "}\n"
      "inline $type$ $classname$::$name$(int index) const {\n"
      "$annotate_get$"
      "  // @@protoc_insertion_point(field_get:$full_name$)\n"
      "  return _internal_$name$(index);\n"
      "}\n"
      "inline void $classname$::set_$name$(int index, $type$ value) {\n");
  if (!HasPreservingUnknownEnumSemantics(descriptor_)) {
    format("  assert($type$_IsValid(value));\n");
  }
  format(
      "  $name$_.Set(index, value);\n"
      "$annotate_set$"
      "  // @@protoc_insertion_point(field_set:$full_name$)\n"
      "}\n"
      "inline void $classname$::_internal_add_$name$($type$ value) {\n");
  if (!HasPreservingUnknownEnumSemantics(descriptor_)) {
    format("  assert($type$_IsValid(value));\n");
  }
  format(
      "  $name$_.Add(value);\n"
      "}\n"
      "inline void $classname$::add_$name$($type$ value) {\n"
      "  _internal_add_$name$(value);\n"
      "$annotate_add$"
      "  // @@protoc_insertion_point(field_add:$full_name$)\n"
      "}\n"
      "inline const ::$proto_ns$::RepeatedField<int>&\n"
      "$classname$::$name$() const {\n"
      "$annotate_list$"
      "  // @@protoc_insertion_point(field_list:$full_name$)\n"
      "  return $name$_;\n"
      "}\n"
      "inline ::$proto_ns$::RepeatedField<int>*\n"
      "$classname$::_internal_mutable_$name$() {\n"
      "  return &$name$_;\n"
      "}\n"
      "inline ::$proto_ns$::RepeatedField<int>*\n"
      "$classname$::mutable_$name$() {\n"
      "$annotate_mutable_list$"
      "  // @@protoc_insertion_point(field_mutable_list:$full_name$)\n"
      "  return _internal_mutable_$name$();\n"
      "}\n");
}